

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::generate_union_constructor(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  bool bVar2;
  pointer pcVar3;
  int iVar4;
  ostream *poVar5;
  t_type *ptVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  pointer pptVar8;
  t_java_generator *this_00;
  char *pcVar9;
  string local_e0;
  string local_c0;
  t_struct *local_a0;
  t_type *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public ",7);
  type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"() {",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (pptVar8 ==
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"super();",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_0024baf5:
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public ",7);
      type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"(_Fields setField, java.lang.Object value) {",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  super(setField, value);",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public ",7);
      type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
      type_name_abi_cxx11_(&local_c0,this,&tstruct->super_t_type,false,false,false,false);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," other) {",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  super(other);",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public ",7);
      iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)CONCAT44(extraout_var,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," deepCopy() {",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  return new ",0xd);
      iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)CONCAT44(extraout_var_00,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(this);",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_a0 = tstruct;
      if (pptVar8 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          ptVar6 = (*pptVar8)->type_;
          poVar5 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public static ",0xe);
          type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar8)->name_)._M_dataplus._M_p,
                              ((*pptVar8)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
          type_name_abi_cxx11_(&local_c0,this,ptVar6,false,false,false,false);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," value) {",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          poVar5 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
          type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," x = new ",9);
          type_name_abi_cxx11_(&local_c0,this,&tstruct->super_t_type,false,false,false,false);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"();",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          local_98 = ptVar6;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          poVar5 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  x.set",7);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar3 = ((*pptVar8)->name_)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,pcVar3 + ((*pptVar8)->name_)._M_string_length);
          get_cap_name(&local_e0,this,&local_70);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
          tstruct = local_a0;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(value);",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          ptVar6 = local_98;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          poVar5 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  return x;",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          poVar5 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          iVar4 = (*(ptVar6->super_t_doc)._vptr_t_doc[7])(ptVar6);
          if ((char)iVar4 != '\0') {
            poVar5 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public static ",0xe);
            type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,((*pptVar8)->name_)._M_dataplus._M_p,
                                ((*pptVar8)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(byte[] value) {",0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p);
            }
            poVar5 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
            type_name_abi_cxx11_(&local_e0,this,&tstruct->super_t_type,false,false,false,false);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," x = new ",9);
            type_name_abi_cxx11_(&local_c0,this,&tstruct->super_t_type,false,false,false,false);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_c0._M_dataplus._M_p,local_c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"();",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p);
            }
            poVar5 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  x.set",7);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            pcVar3 = ((*pptVar8)->name_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar3,pcVar3 + ((*pptVar8)->name_)._M_string_length);
            get_cap_name(&local_e0,this,&local_90);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            bVar2 = this->unsafe_binaries_;
            poVar5 = t_generator::indent((t_generator *)this,out);
            if (bVar2 == true) {
              lVar7 = 0x22;
              pcVar9 = "(java.nio.ByteBuffer.wrap(value));";
            }
            else {
              lVar7 = 0x2a;
              pcVar9 = "(java.nio.ByteBuffer.wrap(value.clone()));";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,lVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            poVar5 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  return x;",0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            poVar5 = t_generator::indent((t_generator *)this,out);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                                ::endl_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
          }
          pptVar8 = pptVar8 + 1;
        } while (pptVar8 !=
                 (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      return;
    }
    ptVar6 = t_type::get_true_type((*pptVar8)->type_);
    if ((*pptVar8)->value_ != (t_const_value *)0x0) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"super(_Fields.",0xe);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      this_00 = (t_java_generator *)((*pptVar8)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,this_00,
                 (pointer)((long)&(this_00->super_t_oop_generator).super_t_generator.
                                  _vptr_t_generator + ((*pptVar8)->name_)._M_string_length));
      constant_name(&local_e0,this_00,&local_50);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_e0._M_dataplus._M_p,local_e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      render_const_value_abi_cxx11_(&local_c0,this,out,ptVar6,(*pptVar8)->value_);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      goto LAB_0024baf5;
    }
    pptVar8 = pptVar8 + 1;
  } while( true );
}

Assistant:

void t_java_generator::generate_union_constructor(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  indent(out) << "public " << type_name(tstruct) << "() {" << endl;
  indent_up();
  bool default_value = false;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_type* type = get_true_type((*m_iter)->get_type());
    if ((*m_iter)->get_value() != nullptr) {
      indent(out) << "super(_Fields." << constant_name((*m_iter)->get_name()) << ", "
                  << render_const_value(out, type, (*m_iter)->get_value()) << ");" << endl;
      default_value = true;
      break;
    }
  }
  if (default_value == false) {
    indent(out) << "super();" << endl;
  }
  indent_down();
  indent(out) << "}" << endl << endl;

  indent(out) << "public " << type_name(tstruct) << "(_Fields setField, java.lang.Object value) {" << endl;
  indent(out) << "  super(setField, value);" << endl;
  indent(out) << "}" << endl << endl;

  indent(out) << "public " << type_name(tstruct) << "(" << type_name(tstruct) << " other) {"
              << endl;
  indent(out) << "  super(other);" << endl;
  indent(out) << "}" << endl;

  indent(out) << "public " << tstruct->get_name() << " deepCopy() {" << endl;
  indent(out) << "  return new " << tstruct->get_name() << "(this);" << endl;
  indent(out) << "}" << endl << endl;

  // generate "constructors" for each field
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_type* type = (*m_iter)->get_type();
    indent(out) << "public static " << type_name(tstruct) << " " << (*m_iter)->get_name() << "("
                << type_name(type) << " value) {" << endl;
    indent(out) << "  " << type_name(tstruct) << " x = new " << type_name(tstruct) << "();" << endl;
    indent(out) << "  x.set" << get_cap_name((*m_iter)->get_name()) << "(value);" << endl;
    indent(out) << "  return x;" << endl;
    indent(out) << "}" << endl << endl;

    if (type->is_binary()) {
      indent(out) << "public static " << type_name(tstruct) << " " << (*m_iter)->get_name()
                  << "(byte[] value) {" << endl;
      indent(out) << "  " << type_name(tstruct) << " x = new " << type_name(tstruct) << "();"
                  << endl;
      indent(out) << "  x.set" << get_cap_name((*m_iter)->get_name());
      if(unsafe_binaries_) {
        indent(out) << "(java.nio.ByteBuffer.wrap(value));" << endl;
      }else{
        indent(out) << "(java.nio.ByteBuffer.wrap(value.clone()));" << endl;
      }
      indent(out) << "  return x;" << endl;
      indent(out) << "}" << endl << endl;
    }
  }
}